

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

size_t write_vars(MIR_context_t ctx,writer_func_t writer,MIR_func_t func,VARR_MIR_var_t *vars,
                 size_t start,size_t vars_num,char *prefix)

{
  bool bVar1;
  MIR_reg_t reg_00;
  size_t sVar2;
  size_t sVar3;
  char *name;
  char *hard_reg_name;
  undefined1 local_70 [4];
  MIR_reg_t reg;
  MIR_var_t var;
  size_t i;
  long lStack_48;
  int first_p;
  size_t len;
  size_t vars_num_local;
  size_t start_local;
  VARR_MIR_var_t *vars_local;
  MIR_func_t func_local;
  writer_func_t writer_local;
  MIR_context_t ctx_local;
  
  if ((vars_num == 0) || (vars == (VARR_MIR_var_t *)0x0)) {
    ctx_local = (MIR_context_t)0x0;
  }
  else {
    lStack_48 = 0;
    bVar1 = true;
    for (var.size = 0; var.size < vars_num; var.size = var.size + 1) {
      VARR_MIR_var_tget((MIR_var_t *)local_70,vars,var.size + start);
      if (bVar1) {
        sVar2 = write_name(ctx,writer,prefix);
        lStack_48 = sVar2 + lStack_48;
      }
      bVar1 = false;
      sVar2 = write_type(ctx,writer,(MIR_type_t)local_70);
      sVar3 = write_name(ctx,writer,(char *)var._0_8_);
      lStack_48 = sVar3 + sVar2 + lStack_48;
      reg_00 = MIR_reg(ctx,(char *)var._0_8_,func);
      name = MIR_reg_hard_reg_name(ctx,reg_00,func);
      if (name != (char *)0x0) {
        sVar2 = write_name(ctx,writer,name);
        lStack_48 = sVar2 + lStack_48;
      }
    }
    sVar2 = put_byte(ctx,writer,0x3d);
    ctx_local = (MIR_context_t)(sVar2 + lStack_48);
  }
  return (size_t)ctx_local;
}

Assistant:

static size_t write_vars (MIR_context_t ctx, writer_func_t writer, MIR_func_t func,
                          VARR (MIR_var_t) * vars, size_t start, size_t vars_num,
                          const char *prefix) {
  if (vars_num == 0 || vars == NULL) return 0;
  size_t len = 0;
  int first_p = TRUE;
  for (size_t i = 0; i < vars_num; i++) {
    MIR_var_t var = VARR_GET (MIR_var_t, vars, i + start);
    if (first_p) len += write_name (ctx, writer, prefix);
    first_p = FALSE;
    len += write_type (ctx, writer, var.type);
    len += write_name (ctx, writer, var.name);
    MIR_reg_t reg = MIR_reg (ctx, var.name, func);
    const char *hard_reg_name = MIR_reg_hard_reg_name (ctx, reg, func);
    if (hard_reg_name != NULL) len += write_name (ctx, writer, hard_reg_name);
  }
  len += put_byte (ctx, writer, TAG_EOI);
  return len;
}